

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O1

ErrorNumber checkSameContent(TA_Real *buffer1,TA_Real *buffer2)

{
  double dVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    dVar1 = buffer1[lVar2 + -100];
    if (((dVar1 != 8.1489031e-158) || (NAN(dVar1))) && ((dVar1 != 9.1349043e-200 || (NAN(dVar1)))))
    {
      if ((dVar1 <= buffer2[lVar2 + -100] + -1e-06) || (buffer2[lVar2 + -100] + 1e-06 <= dVar1)) {
        printf("Fail: Large difference found between two value expected identical (%f,%f,%d)\n");
        return TA_TEST_TFRR_CHECK_SAME_CONTENT;
      }
    }
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x1e0) {
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber checkSameContent( TA_Real *buffer1,
                              TA_Real *buffer2 )
{
   const TA_Real *theBuffer1;
   const TA_Real *theBuffer2;

   unsigned int i;

   theBuffer1 = buffer1 - TA_BUF_PREFIX;
   theBuffer2 = buffer2 - TA_BUF_PREFIX;

   for( i=0; i < TA_BUF_SIZE; i++ )
   {
        /* TODO Add back nan/inf checking
          (!trio_isnan(theBuffer1[i])) &&
          (!trio_isinf(theBuffer1[i])) &&
         */

      if( (theBuffer1[i] != RESV_PATTERN_SUFFIX) &&
          (theBuffer1[i] != RESV_PATTERN_PREFIX) )
      {

         if(!TA_REAL_EQ( theBuffer1[i], theBuffer2[i], 0.000001))
         {
            printf( "Fail: Large difference found between two value expected identical (%f,%f,%d)\n",
                     theBuffer1[i], theBuffer2[i], i );
            return TA_TEST_TFRR_CHECK_SAME_CONTENT;
         }
      }
   }

   return TA_TEST_PASS;
}